

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall Lib::Stack<Parse::TPTP::Tag>::~Stack(Stack<Parse::TPTP::Tag> *this)

{
  Tag *pTVar1;
  ulong uVar2;
  
  pTVar1 = this->_stack;
  if (pTVar1 != (Tag *)0x0) {
    uVar2 = this->_capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *(undefined8 *)pTVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pTVar1;
      return;
    }
    if (uVar2 < 0x11) {
      *(undefined8 *)pTVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pTVar1;
      return;
    }
    if (uVar2 < 0x19) {
      *(undefined8 *)pTVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pTVar1;
      return;
    }
    if (uVar2 < 0x21) {
      *(undefined8 *)pTVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pTVar1;
      return;
    }
    if (uVar2 < 0x31) {
      *(undefined8 *)pTVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pTVar1;
      return;
    }
    if (0x40 < uVar2) {
      operator_delete(pTVar1,0x10);
      return;
    }
    *(undefined8 *)pTVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pTVar1;
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }